

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

char * get_device_type_name(VkPhysicalDeviceType type)

{
  char *pcStack_10;
  VkPhysicalDeviceType type_local;
  
  if (type == VK_PHYSICAL_DEVICE_TYPE_BEGIN_RANGE) {
    pcStack_10 = "other";
  }
  else if (type == VK_PHYSICAL_DEVICE_TYPE_INTEGRATED_GPU) {
    pcStack_10 = "integrated GPU";
  }
  else if (type == VK_PHYSICAL_DEVICE_TYPE_DISCRETE_GPU) {
    pcStack_10 = "discrete GPU";
  }
  else if (type == VK_PHYSICAL_DEVICE_TYPE_VIRTUAL_GPU) {
    pcStack_10 = "virtual GPU";
  }
  else if (type == VK_PHYSICAL_DEVICE_TYPE_CPU) {
    pcStack_10 = "CPU";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

static const char* get_device_type_name(VkPhysicalDeviceType type)
{
    if (type == VK_PHYSICAL_DEVICE_TYPE_OTHER)
        return "other";
    else if (type == VK_PHYSICAL_DEVICE_TYPE_INTEGRATED_GPU)
        return "integrated GPU";
    else if (type == VK_PHYSICAL_DEVICE_TYPE_DISCRETE_GPU)
        return "discrete GPU";
    else if (type == VK_PHYSICAL_DEVICE_TYPE_VIRTUAL_GPU)
        return "virtual GPU";
    else if (type == VK_PHYSICAL_DEVICE_TYPE_CPU)
        return "CPU";

    return "unknown";
}